

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureGatherTests.cpp
# Opt level: O3

long __thiscall gl4cts::anon_unknown_0::PlainGatherInt2DRect::Verify(PlainGatherInt2DRect *this)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  IVec4 data;
  int aiStack_14 [3];
  
  data.m_data[0] = 0;
  data.m_data[1] = 0;
  data.m_data[2] = 0;
  data.m_data[3] = 0;
  glu::CallLogWrapper::glReadPixels
            (&(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0,0,1,1,0x8d99,0x1404,&data);
  aiStack_14[1] = 8;
  aiStack_14[2] = 0xc;
  if (data.m_data[0] == 0) {
    uVar4 = 0xffffffffffffffff;
    do {
      if (uVar4 == 2) {
        return 0;
      }
      lVar2 = uVar4 + 2;
      uVar1 = uVar4 + 1;
      lVar3 = uVar4 + 1;
      uVar4 = uVar1;
    } while (data.m_data[lVar2] == aiStack_14[lVar3]);
    if (2 < uVar1) {
      return 0;
    }
  }
  anon_unknown_0::Output
            ("Expected 0, 4, 8, 12, got: %d, %d, %d, %d",data.m_data._0_8_ & 0xffffffff,
             (ulong)data.m_data._0_8_ >> 0x20,data.m_data._8_8_ & 0xffffffff,
             (ulong)data.m_data._8_8_ >> 0x20);
  return -1;
}

Assistant:

GLuint CreateComputeProgram(const std::string& cs)
	{
		const GLuint p = glCreateProgram();

		if (!cs.empty())
		{
			const GLuint sh = glCreateShader(GL_COMPUTE_SHADER);
			glAttachShader(p, sh);
			glDeleteShader(sh);
			const char* const src[1] = { cs.c_str() };
			glShaderSource(sh, 1, src, NULL);
			glCompileShader(sh);
		}

		return p;
	}